

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSDist_COF.cpp
# Opt level: O0

double __thiscall
FSDist_COF::GetProbability
          (FSDist_COF *this,Scope *sfSc,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sfacValues)

{
  ulong __n;
  size_type sVar1;
  const_reference pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double p_this_sf;
  Index sfValI_sfI;
  Index sfI;
  Index i;
  double p;
  undefined4 local_24;
  undefined8 local_20;
  
  local_20 = 1.0;
  local_24 = 0;
  while( true ) {
    __n = (ulong)local_24;
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
    if (sVar1 <= __n) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,__n);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,__n);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::at((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *)in_RDI,__n);
    pvVar2 = std::vector<double,_std::allocator<double>_>::at(in_RDI,__n);
    local_20 = *pvVar2 * local_20;
    local_24 = local_24 + 1;
  }
  return local_20;
}

Assistant:

double FSDist_COF::GetProbability(const Scope& sfSc,
                                  const std::vector<Index>& sfacValues) const
{
    double p = 1.0;
    for(Index i=0; i < sfSc.size(); i++)
    {
        Index sfI = sfSc.at(i);
        Index sfValI_sfI = sfacValues.at(i);
        double p_this_sf = _m_probs.at(sfI).at(sfValI_sfI);
        p *= p_this_sf;
    }
    
    return p;
}